

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * util::str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
                   (char (*args) [27],char (*args_1) [87],char (*args_2) [2],int *args_3,
                   char (*args_4) [3],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  string *in_RDI;
  char (*in_stack_00000008) [3];
  ostringstream ss;
  string *args_1_00;
  ostringstream *this;
  char (*in_stack_fffffffffffffe48) [27];
  ostream *in_stack_fffffffffffffe50;
  ostringstream local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  
  this = local_1a8;
  args_1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  detail::_str<char[27],char[87],char[2],int,char[3],std::__cxx11::string>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(char (*) [87])this,
             (char (*) [2])args_1_00,(int *)in_RDI,in_stack_00000008,in_stack_fffffffffffffe60);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return args_1_00;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}